

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Material::Material(Material *this,string *name)

{
  this->_vptr_Material = (_func_int **)&PTR__Material_00732150;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  (this->mDiffuse).r = 0.6;
  (this->mDiffuse).g = 0.6;
  *(undefined8 *)&(this->mDiffuse).b = 0x3f19999a;
  this->mShininessStrength = 1.0;
  (this->mAmbient).g = 0.0;
  (this->mAmbient).b = 0.0;
  (this->mSpecular).r = 0.0;
  (this->mSpecular).g = 0.0;
  *(undefined8 *)&(this->mSpecular).b = 0;
  this->mShading = Gouraud;
  this->mTransparency = 1.0;
  Texture::Texture(&this->sTexDiffuse);
  Texture::Texture(&this->sTexOpacity);
  Texture::Texture(&this->sTexSpecular);
  Texture::Texture(&this->sTexReflective);
  Texture::Texture(&this->sTexBump);
  Texture::Texture(&this->sTexEmissive);
  Texture::Texture(&this->sTexShininess);
  this->mBumpHeight = 1.0;
  (this->mEmissive).r = 0.0;
  (this->mEmissive).g = 0.0;
  (this->mEmissive).b = 0.0;
  Texture::Texture(&this->sTexAmbient);
  this->mTwoSided = false;
  return;
}

Assistant:

explicit Material(const std::string &name)
    : mName(name)
    , mDiffuse            ( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ) ) // FIX ... we won't want object to be black
    , mSpecularExponent   ( ai_real( 0.0 ) )
    , mShininessStrength  ( ai_real( 1.0 ) )
    , mShading(Discreet3DS::Gouraud)
    , mTransparency       ( ai_real( 1.0 ) )
    , mBumpHeight         ( ai_real( 1.0 ) )
    , mTwoSided           (false)
    {
    }